

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

size_t __thiscall CompiledHeaderList::compiled_size(CompiledHeaderList *this)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  
  uVar3 = 0;
  p_Var4 = (_List_node_base *)this;
  while( true ) {
    p_Var4 = (((list<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>,_std::allocator<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>_>_>
                *)&p_Var4->_M_next)->
             super__List_base<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>,_std::allocator<eggs::variants::variant<CompiledScmHeader,_CustomHeaderOATC>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)this) {
      return (ulong)uVar3;
    }
    uVar1 = *(ulong *)(p_Var4 + 5);
    if (uVar1 == 0) break;
    if (2 < uVar1) {
      __assert_fail("index < size && \"discriminator out of range\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/variant/include/eggs/variant/detail/visitor.hpp"
                    ,0x36,
                    "static int eggs::variants::detail::visitor<eggs::variants::detail::_apply<unsigned long, (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/codegen.cpp:109:41), eggs::variants::detail::pack<>, eggs::variants::detail::pack<const eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty, CompiledScmHeader, CustomHeaderOATC>, false, false> &>>, unsigned long ((lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/codegen.cpp:109:41) &&, const eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty, CompiledScmHeader, CustomHeaderOATC>, false, false> &)>::_assert_in_range_failure(std::size_t, std::size_t) [F = eggs::variants::detail::_apply<unsigned long, (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/codegen.cpp:109:41), eggs::variants::detail::pack<>, eggs::variants::detail::pack<const eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty, CompiledScmHeader, CustomHeaderOATC>, false, false> &>>, Sig = unsigned long ((lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/codegen.cpp:109:41) &&, const eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty, CompiledScmHeader, CustomHeaderOATC>, false, false> &)]"
                   );
    }
    iVar2 = (*eggs::variants::detail::
              visitor<eggs::variants::detail::_apply<void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/codegen.cpp:54:31),_eggs::variants::detail::pack<>,_eggs::variants::detail::pack<const_eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>_&>_>,_void_((lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/codegen.cpp:54:31)_&&,_const_eggs::variants::detail::_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>_&)>
              ::_table<eggs::variants::detail::index<1UL>,_eggs::variants::detail::index<2UL>_>::
              value[uVar1 + 1])((anon_class_8_1_8991fb9c *)&stack0xffffffffffffffd7,
                                (_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_CompiledScmHeader,_CustomHeaderOATC>,_false,_false>
                                 *)(p_Var4 + 1));
    uVar3 = uVar3 + iVar2;
  }
  eggs::variants::detail::throw_bad_variant_access<unsigned_long>();
}

Assistant:

size_t CompiledHeaderList::compiled_size() const
{
    return std::accumulate(headers.begin(), headers.end(), 0u, [](uint32_t size, const auto& header) {
        return size + visit_one(header, [](const auto& h) { return h.compiled_size(); });
    });
}